

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O0

int XLearnPredictForMat(XL *out,char *model_path,uint64 *length,float **out_arr)

{
  int iVar1;
  HyperParam *pHVar2;
  Solver *pSVar3;
  reference pvVar4;
  size_type sVar5;
  undefined8 *in_RCX;
  size_type *in_RDX;
  char *in_RSI;
  undefined8 *in_RDI;
  float fVar6;
  runtime_error *_except_;
  vector<float,_std::allocator<float>_> *preds;
  XLearn *xl;
  Timer timer;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  Solver *in_stack_fffffffffffffed0;
  string *out_00;
  vector<float,_std::allocator<float>_> *this;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffee0;
  string local_b8 [32];
  vector<float,_std::allocator<float>_> *local_98;
  undefined1 local_90 [32];
  string local_70 [16];
  Solver *in_stack_ffffffffffffffa0;
  XLearn *this_00;
  
  Timer::Timer((Timer *)in_stack_fffffffffffffed0);
  Timer::tic((Timer *)in_stack_fffffffffffffed0);
  this_00 = (XLearn *)*in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,in_RSI,(allocator *)(local_90 + 0x1f));
  pHVar2 = XLearn::GetHyperParam(this_00);
  std::__cxx11::string::operator=((string *)&pHVar2->model_file,local_70);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)(local_90 + 0x1f));
  pHVar2 = XLearn::GetHyperParam(this_00);
  pHVar2->res_out = false;
  pHVar2 = XLearn::GetHyperParam(this_00);
  pHVar2->is_train = false;
  XLearn::GetSolver(this_00);
  XLearn::GetHyperParam(this_00);
  xLearn::Solver::Initialize
            (in_stack_fffffffffffffed0,
             (HyperParam *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  pSVar3 = XLearn::GetSolver(this_00);
  xLearn::Solver::SetPredict(pSVar3);
  XLearn::GetSolver(this_00);
  xLearn::Solver::StartWork((Solver *)this_00);
  if (XLearnPredictForMat::tmp_preds == '\0') {
    iVar1 = __cxa_guard_acquire(&XLearnPredictForMat::tmp_preds);
    if (iVar1 != 0) {
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)0x1d7454);
      __cxa_atexit(std::vector<float,_std::allocator<float>_>::~vector,
                   &XLearnPredictForMat::tmp_preds,&__dso_handle);
      __cxa_guard_release(&XLearnPredictForMat::tmp_preds);
    }
  }
  XLearn::GetSolver(this_00);
  xLearn::Solver::GetResult((Solver *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8))
  ;
  this = &XLearnPredictForMat::tmp_preds;
  out_00 = (string *)local_90;
  std::vector<float,_std::allocator<float>_>::operator=
            (in_stack_fffffffffffffee0,&XLearnPredictForMat::tmp_preds);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffee0);
  local_98 = this;
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](this,0);
  *in_RCX = pvVar4;
  sVar5 = std::vector<float,_std::allocator<float>_>::size(this);
  *in_RDX = sVar5;
  pSVar3 = XLearn::GetSolver(this_00);
  xLearn::Solver::Clear(in_stack_ffffffffffffffa0);
  fVar6 = Timer::toc((Timer *)pSVar3);
  StringPrintf_abi_cxx11_((char *)(double)fVar6,local_b8,"Total time cost: %.2f (sec)");
  Color::print_info(out_00,SUB41((uint)fVar6 >> 0x18,0));
  std::__cxx11::string::~string(local_b8);
  return 0;
}

Assistant:

XL_DLL int XLearnPredictForMat(XL *out, const char *model_path, 
                               uint64 *length,
                               const float** out_arr) {
  API_BEGIN();
  Timer timer;
  timer.tic();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  xl->GetHyperParam().model_file = std::string(model_path);
  xl->GetHyperParam().res_out = false;
  xl->GetHyperParam().is_train = false;
  xl->GetSolver().Initialize(xl->GetHyperParam());
  xl->GetSolver().SetPredict();
  xl->GetSolver().StartWork();
  static std::vector<real_t> tmp_preds;
  tmp_preds = xl->GetSolver().GetResult();
  std::vector<real_t> &preds = tmp_preds;
  *out_arr = &preds[0];
  *length = static_cast<uint64>(preds.size());
  xl->GetSolver().Clear();
  Color::print_info(
    StringPrintf("Total time cost: %.2f (sec)", 
    timer.toc()), true);
  API_END();
}